

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scolumn_bmod.c
# Opt level: O2

int scolumn_bmod(int jcol,int nseg,float *dense,float *tempv,int *segrep,int *repfnz,int fpanelc,
                GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int_t iVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  float *pfVar9;
  uint uVar10;
  long lVar11;
  uint nrow;
  int iVar12;
  float *pfVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int *piVar20;
  uint uVar21;
  int ldm;
  int_t *piVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  int_t nzlumax;
  void *local_c8;
  int local_a4;
  int *local_a0;
  int *local_98;
  int_t *local_90;
  int_t *local_88;
  long local_80;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  long local_60;
  flops_t *local_58;
  int *local_50;
  long local_48;
  long local_40;
  int *local_38;
  
  local_58 = stat->ops;
  local_50 = Glu->xsup;
  piVar20 = Glu->supno;
  piVar22 = Glu->lsub;
  local_90 = Glu->xlsub;
  local_c8 = Glu->lusup;
  local_88 = Glu->xlusup;
  local_a4 = Glu->nzlumax;
  lVar11 = (long)nseg;
  local_6c = 0;
  if (0 < nseg) {
    local_6c = nseg;
  }
  local_68 = (long)jcol;
  local_48 = (long)piVar20[local_68];
  local_60 = (long)local_c8 + 4;
  local_a0 = piVar20;
  local_98 = segrep;
  local_74 = local_a4;
  local_70 = jcol;
  local_38 = repfnz;
  for (iVar3 = 0; iVar3 != local_6c; iVar3 = iVar3 + 1) {
    lVar11 = lVar11 + -1;
    iVar1 = segrep[lVar11];
    if ((int)local_48 != piVar20[iVar1]) {
      iVar18 = local_50[piVar20[iVar1]];
      iVar14 = fpanelc;
      if (fpanelc < iVar18) {
        iVar14 = iVar18;
      }
      iVar17 = iVar14 - iVar18;
      iVar8 = local_88[iVar14] + iVar17;
      iVar12 = local_90[iVar18];
      iVar2 = local_38[iVar1];
      if (local_38[iVar1] <= fpanelc) {
        iVar2 = fpanelc;
      }
      uVar21 = (iVar1 - iVar2) + 1;
      uVar16 = iVar1 - iVar14;
      lVar5 = (long)local_90[(long)iVar18 + 1];
      ldm = local_90[(long)iVar18 + 1] - iVar12;
      nrow = (~uVar16 - iVar17) + ldm;
      local_58[0x13] = (float)(int)((iVar1 - iVar2) * uVar21) + local_58[0x13];
      iVar12 = iVar12 + iVar17;
      iVar18 = uVar16 + iVar12 + 1;
      local_58[0x14] = (float)(int)(nrow * uVar21 * 2) + local_58[0x14];
      lVar19 = (long)(int)(iVar12 + uVar16);
      uVar10 = iVar1 - iVar2;
      segrep = local_98;
      piVar20 = local_a0;
      local_80 = lVar11;
      if (uVar10 == 0) {
        fVar25 = dense[piVar22[lVar19]];
        pfVar9 = (float *)((long)local_c8 + (long)(int)(iVar8 + uVar16 + 1 + ldm * uVar16) * 4);
        for (lVar19 = (long)iVar18; lVar19 < lVar5; lVar19 = lVar19 + 1) {
          dense[piVar22[lVar19]] = *pfVar9 * -fVar25 + dense[piVar22[lVar19]];
          pfVar9 = pfVar9 + 1;
        }
      }
      else if ((int)uVar10 < 3) {
        iVar1 = piVar22[lVar19];
        iVar8 = (ldm + 1) * uVar16 + iVar8;
        iVar14 = piVar22[lVar19 + -1];
        fVar25 = dense[iVar14];
        lVar15 = (long)(iVar8 - ldm);
        if (uVar21 == 2) {
          fVar23 = dense[iVar1] - *(float *)((long)local_c8 + lVar15 * 4) * fVar25;
          dense[iVar1] = fVar23;
          for (lVar19 = 0; iVar18 + lVar19 < lVar5; lVar19 = lVar19 + 1) {
            dense[piVar22[iVar18 + lVar19]] =
                 dense[piVar22[iVar18 + lVar19]] -
                 (*(float *)(local_60 + (long)iVar8 * 4 + lVar19 * 4) * fVar23 +
                 *(float *)(local_60 + lVar15 * 4 + lVar19 * 4) * fVar25);
          }
        }
        else {
          fVar23 = dense[piVar22[lVar19 + -2]];
          lVar19 = (long)((iVar8 - ldm) - ldm);
          fVar25 = fVar25 - *(float *)((long)local_c8 + lVar19 * 4 + -4) * fVar23;
          fVar24 = (dense[iVar1] - *(float *)((long)local_c8 + lVar15 * 4) * fVar25) -
                   *(float *)((long)local_c8 + lVar19 * 4) * fVar23;
          dense[iVar1] = fVar24;
          dense[iVar14] = fVar25;
          pfVar9 = (float *)(local_60 + (long)iVar8 * 4);
          pfVar13 = (float *)(local_60 + lVar15 * 4);
          for (lVar19 = (long)iVar18; lVar19 < lVar5; lVar19 = lVar19 + 1) {
            dense[piVar22[lVar19]] =
                 dense[piVar22[lVar19]] -
                 (pfVar13[-(long)ldm] * fVar23 + *pfVar9 * fVar24 + *pfVar13 * fVar25);
            pfVar9 = pfVar9 + 1;
            pfVar13 = pfVar13 + 1;
          }
        }
      }
      else {
        piVar20 = piVar22 + (iVar12 + (iVar2 - iVar14));
        for (uVar6 = 0; uVar6 <= uVar10; uVar6 = uVar6 + 1) {
          tempv[uVar6] = dense[piVar20[uVar6]];
        }
        local_40 = (long)((ldm + 1) * (iVar2 - iVar14) + iVar8);
        slsolve(ldm,uVar21,(float *)((long)local_c8 + local_40 * 4),tempv);
        pfVar9 = tempv + uVar21;
        smatvec(ldm,nrow,uVar21,(float *)((long)local_c8 + (long)(int)((int)local_40 + uVar21) * 4),
                tempv,pfVar9);
        piVar7 = piVar20;
        for (uVar6 = 0; uVar6 <= uVar10; uVar6 = uVar6 + 1) {
          dense[piVar20[uVar6]] = tempv[uVar6];
          tempv[uVar6] = 0.0;
          piVar7 = piVar7 + 1;
        }
        if ((int)nrow < 1) {
          nrow = 0;
        }
        for (uVar6 = 0; lVar11 = local_80, segrep = local_98, piVar20 = local_a0, nrow != uVar6;
            uVar6 = uVar6 + 1) {
          dense[*piVar7] = dense[*piVar7] - pfVar9[uVar6];
          pfVar9[uVar6] = 0.0;
          piVar7 = piVar7 + 1;
        }
      }
    }
  }
  iVar3 = local_88[local_68];
  iVar1 = local_50[local_48];
  iVar18 = local_90[(long)iVar1 + 1];
  iVar14 = local_90[iVar1];
  iVar12 = local_74;
  while( true ) {
    if ((iVar18 + iVar3) - iVar14 <= iVar12) {
      iVar18 = local_90[(long)iVar1 + 1];
      pfVar9 = (float *)((long)local_c8 + (long)iVar3 * 4);
      for (lVar11 = (long)local_90[iVar1]; lVar11 < iVar18; lVar11 = lVar11 + 1) {
        iVar14 = piVar22[lVar11];
        *pfVar9 = dense[iVar14];
        dense[iVar14] = 0.0;
        iVar3 = iVar3 + 1;
        pfVar9 = pfVar9 + 1;
      }
      if (fpanelc < iVar1) {
        fpanelc = iVar1;
      }
      local_88[local_68 + 1] = iVar3;
      iVar3 = (int)local_68;
      iVar18 = iVar3 - fpanelc;
      if (iVar18 != 0 && fpanelc <= iVar3) {
        iVar14 = local_88[fpanelc];
        iVar12 = local_90[(long)iVar1 + 1] - local_90[iVar1];
        uVar21 = (iVar1 - iVar3) + iVar12;
        iVar3 = local_88[local_68];
        local_58[0x13] = (float)((iVar18 + -1) * iVar18) + local_58[0x13];
        lVar11 = (long)iVar14 + (long)(fpanelc - iVar1);
        lVar5 = (long)iVar3 + (long)(fpanelc - iVar1);
        local_58[0x14] = (float)(int)(iVar18 * uVar21 * 2) + local_58[0x14];
        pfVar9 = (float *)((long)local_c8 + lVar5 * 4);
        slsolve(iVar12,iVar18,(float *)((long)local_c8 + lVar11 * 4),pfVar9);
        smatvec(iVar12,uVar21,iVar18,(float *)((long)local_c8 + (long)((int)lVar11 + iVar18) * 4),
                pfVar9,tempv);
        iVar18 = iVar18 + (int)lVar5;
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        for (uVar6 = 0; uVar21 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)((long)local_c8 + uVar6 * 4 + (long)iVar18 * 4) =
               *(float *)((long)local_c8 + uVar6 * 4 + (long)iVar18 * 4) - tempv[uVar6];
          tempv[uVar6] = 0.0;
        }
      }
      return 0;
    }
    iVar4 = sLUMemXpand(local_70,iVar3,LUSUP,&local_a4,Glu);
    if (iVar4 != 0) break;
    piVar22 = Glu->lsub;
    local_c8 = Glu->lusup;
    iVar12 = local_a4;
  }
  return iVar4;
}

Assistant:

int
scolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     float     *dense,	  /* in */
	     float     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    float      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    float      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    float       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    float       *tempv1;
    float      zero = 0.0;
    float      one = 1.0;
    float      none = -1.0;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (float *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += segsze * (segsze - 1);
	    ops[GEMV] += 2 * nrow * segsze;


	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    dense[irow] -=  ukj*lusup[luptr];
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    ukj -= ukj1 * lusup[luptr1];
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
		    	dense[irow] -= ( ukj*lusup[luptr]
					+ ukj1*lusup[luptr1] );
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
		    ukj1 -= ukj2 * lusup[luptr2-1];
		    ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
		    	dense[irow] -= ( ukj*lusup[luptr]
			     + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
		    }
		}



	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		strsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		SGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		sgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		slsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		smatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    dense[irow] -= tempv1[i];
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = sLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (float *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += nsupc * (nsupc - 1);
	ops[GEMV] += 2 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	strsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	SGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	sgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	slsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	smatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    lusup[isub] -= tempv[i];
	    tempv[i] = 0.0;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}